

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O2

void * lj_ccallback_new(CTState *cts,CType *ct,GCfunc *fn)

{
  uint uVar1;
  CType *pCVar2;
  GCtab *t;
  global_State *pgVar3;
  uint64_t uVar4;
  uint uVar5;
  ulong uVar6;
  TValue *pTVar7;
  undefined8 *start;
  CTypeID1 *p;
  undefined8 *puVar8;
  char cVar9;
  int iVar10;
  ushort uVar11;
  undefined8 *puVar12;
  undefined1 uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  GCobj *o;
  
  uVar1 = ct->info;
  if (((uVar1 & 0xf0000000) == 0x20000000) && (ct->size == 8)) {
    pCVar2 = cts->tab;
    uVar15 = pCVar2[(ulong)uVar1 & 0xffff].info;
    if ((uVar15 & 0xf0000000) == 0x60000000) {
      uVar11 = pCVar2[(ulong)uVar1 & 0xffff].sib;
      uVar5 = pCVar2[uVar15 & 0xffff].info >> 0x1c;
      if ((uVar5 < 6) && ((0x34U >> uVar5 & 1) != 0)) {
        if ((uVar15 >> 0x17 & 1) != 0) {
          return (void *)0x0;
        }
      }
      else {
        if (0xfffffff < pCVar2[uVar15 & 0xffff].info) {
          return (void *)0x0;
        }
        if ((uVar15 >> 0x17 & 1) != 0) {
          return (void *)0x0;
        }
        if (8 < pCVar2[uVar15 & 0xffff].size) {
          return (void *)0x0;
        }
      }
      iVar10 = 0;
      for (; uVar11 != 0; uVar11 = pCVar2[uVar11].sib) {
        uVar14 = (ulong)pCVar2[uVar11].info & 0xffff;
        uVar15 = pCVar2[uVar14].info >> 0x1c;
        if ((uVar15 != 2) && (uVar15 != 5)) {
          if (0xfffffff < pCVar2[uVar14].info) {
            return (void *)0x0;
          }
          if (8 < pCVar2[uVar14].size) {
            return (void *)0x0;
          }
        }
        if (0xf < iVar10) {
          return (void *)0x0;
        }
        iVar10 = iVar10 + 1;
      }
      p = (cts->cb).cbid;
      uVar16 = (ulong)(cts->cb).topid;
      uVar6 = (ulong)(cts->cb).sizeid;
      uVar14 = uVar6;
      if (uVar6 < uVar16) {
        uVar14 = uVar16;
      }
      for (; uVar16 < uVar6; uVar16 = uVar16 + 1) {
        if (p[uVar16] == 0) {
          uVar14 = uVar16 & 0xffffffff;
          goto LAB_0013e75c;
        }
      }
      if (0x37f < uVar14) {
LAB_0013e935:
        lj_err_caller(cts->L,LJ_ERR_FFI_CBACKOV);
      }
      if ((cts->cb).mcode == (void *)0x0) {
        start = (undefined8 *)mmap64((void *)0x0,0x1000,3,0x22,-1,0);
        if (start == (undefined8 *)0xffffffffffffffff) goto LAB_0013e935;
        (cts->cb).mcode = start;
        pgVar3 = cts->g;
        *start = lj_vm_ffi_callback;
        puVar8 = start + 1;
        for (uVar15 = 0; uVar15 != 0x380; uVar15 = uVar15 + 1) {
          *(undefined1 *)puVar8 = 0xb0;
          *(char *)((long)puVar8 + 1) = (char)uVar15;
          if ((uVar15 & 0x1f) == 0x1f) {
            *(char *)((long)puVar8 + 4) = (char)(uVar15 >> 8);
            *(undefined2 *)((long)puVar8 + 5) = 0xbd48;
            *(global_State **)((long)puVar8 + 7) = pgVar3;
            *(undefined2 *)((long)puVar8 + 0xf) = 0x25ff;
            puVar12 = (undefined8 *)((long)puVar8 + 0x15);
            *(int *)((long)puVar8 + 0x11) = (int)start - (int)puVar12;
            cVar9 = -0x4c;
            uVar13 = 0x55;
          }
          else {
            cVar9 = ((char)(uVar15 & 0x1f) << 2 ^ 0x7cU) - 2;
            puVar12 = (undefined8 *)((long)puVar8 + 4);
            uVar13 = 0xeb;
          }
          *(undefined1 *)((long)puVar8 + 2) = uVar13;
          *(char *)((long)puVar8 + 3) = cVar9;
          puVar8 = puVar12;
        }
        lj_mcode_sync(start,start + 0x200);
        mprotect(start,0x1000,5);
      }
      p = (CTypeID1 *)lj_mem_grow(cts->L,p,&(cts->cb).sizeid,0x380,2);
      (cts->cb).cbid = p;
      memset(p + uVar14,0,(ulong)((cts->cb).sizeid - (int)uVar14) * 2);
      uVar16 = uVar14;
LAB_0013e75c:
      p[uVar14] = (CTypeID1)uVar1;
      uVar1 = (uint)uVar16;
      (cts->cb).topid = uVar1 + 1;
      t = cts->miscmap;
      if (uVar1 < t->asize) {
        pTVar7 = (TValue *)((long)(int)uVar1 * 8 + (t->array).ptr64);
      }
      else {
        pTVar7 = lj_tab_setinth(cts->L,t,uVar1);
      }
      pTVar7->u64 = (ulong)fn | 0xfffb800000000000;
      if ((t->marked & 4) != 0) {
        uVar4 = (cts->L->glref).ptr64;
        t->marked = t->marked & 0xfb;
        (t->gclist).gcptr64 = *(uint64_t *)(uVar4 + 0x40);
        *(GCtab **)(uVar4 + 0x40) = t;
      }
      return (void *)((ulong)(((uint)(uVar16 >> 5) & 0x7ffffff) * 0x11 + uVar1 * 4 + 8) +
                     (long)(cts->cb).mcode);
    }
  }
  return (void *)0x0;
}

Assistant:

void *lj_ccallback_new(CTState *cts, CType *ct, GCfunc *fn)
{
  ct = callback_checkfunc(cts, ct);
  if (ct) {
    MSize slot = callback_slot_new(cts, ct);
    GCtab *t = cts->miscmap;
    setfuncV(cts->L, lj_tab_setint(cts->L, t, (int32_t)slot), fn);
    lj_gc_anybarriert(cts->L, t);
    return callback_slot2ptr(cts, slot);
  }
  return NULL;  /* Bad conversion. */
}